

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void getHighestScore(int *score)

{
  bool bVar1;
  byte bVar2;
  ostream *poVar3;
  bool newScore;
  exception *e;
  unique_lock<std::mutex> lck;
  fstream result;
  ostream local_458 [528];
  long local_248;
  fstream previous_result;
  undefined1 local_38 [8];
  string input;
  int r;
  int *score_local;
  
  input.field_2._12_4_ = 0;
  std::__cxx11::string::string((string *)local_38);
  std::fstream::fstream(&local_248);
  std::fstream::fstream(&lck._M_owns);
  while (((Mycontroller::quit ^ 0xffU) & 1) != 0) {
    std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)&e,&mtx);
    std::condition_variable::wait((unique_lock *)con_var);
    std::fstream::open((char *)&local_248,0x10f004);
    bVar2 = std::ios::operator!((ios *)((long)&local_248 + *(long *)(local_248 + -0x18)));
    if ((bVar2 & 1) == 0) {
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&local_248,(string *)local_38);
      input.field_2._12_4_ = std::__cxx11::stoi((string *)local_38,(size_t *)0x0,10);
      std::operator<<((ostream *)&std::cout,"\nDone reading from file\n");
      Mycontroller::highestScore = input.field_2._12_4_;
      std::fstream::close();
    }
    else {
      std::operator<<((ostream *)&std::cerr,"\n Can\'t read the previous record \n");
      std::ios::clear((long)&local_248 + *(long *)(local_248 + -0x18),0);
    }
    bVar1 = (int)input.field_2._12_4_ < *score;
    poVar3 = std::operator<<((ostream *)&std::cout,"score = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*score);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    if (bVar1) {
      std::fstream::open(&lck._M_owns,0x10f004);
      bVar2 = std::ios::operator!((ios *)(&lck._M_owns + *(long *)(lck._8_8_ + -0x18)));
      if ((bVar2 & 1) == 0) {
        std::ostream::operator<<(local_458,*score);
        std::operator<<((ostream *)&std::cout,"\nwrote into file\n");
      }
      else {
        std::operator<<((ostream *)&std::cerr,"\nfailed to create ..file not available\n");
      }
      std::fstream::close();
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&e);
  }
  std::fstream::~fstream(&lck._M_owns);
  std::fstream::~fstream(&local_248);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void getHighestScore(int& score){
  int r{0};
  std::string  input;
  std::fstream previous_result;
 std::fstream result;
 while(!Mycontroller::quit){

  std::unique_lock<std::mutex> lck(mtx);
  con_var.wait(lck );

  previous_result.open("result.txt", std::ios::in);
  if(!previous_result){
    std::cerr << "\n Can't read the previous record \n" ;
    previous_result.clear();
  } else{
    try{  
      std::getline(previous_result,input);
      r = std::stoi(input);
      std::cout<<"\nDone reading from file\n";

      Mycontroller::highestScore = r;
    }catch(std::exception& e){
      std::cout << e.what();
    }

   previous_result.close();
  }

 
bool newScore = r < score;
// std::cout << "\nnew score is " << newScore <<std::endl;
// std::cout << "r = " << r << std::endl;

std::cout << "score = " << score << std::endl;

  if(newScore){
    result.open("result.txt", std::ios::out);
    if(!result){
      std::cerr << "\nfailed to create ..file not available\n" ;
    }
    else{
      result << score;
      std::cout<<"\nwrote into file\n";
    }
    result.close();
  }


  }
}